

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O1

void dma_heap_init(void)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  MPP_RET MVar4;
  RK_S32 *pRVar5;
  long lVar6;
  RK_U32 orig;
  ulong uVar7;
  char buf [64];
  char acStack_78 [72];
  
  mpp_env_get_u32("dma_heap_debug",&dma_heap_debug,0);
  bVar2 = true;
  lVar6 = 0;
  do {
    if (*(int *)((long)&heap_infos[0].fd + lVar6) < 1) {
      uVar1 = *(undefined8 *)((long)&heap_infos[0].name + lVar6);
      snprintf(acStack_78,0x3f,"%s%s","/dev/dma_heap/",uVar1);
      uVar3 = open64(acStack_78,0x80000);
      if (((byte)dma_heap_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_dma_heap","open dma_heap %-24s -> fd %d\n",(char *)0x0,uVar1,(ulong)uVar3)
        ;
      }
      *(uint *)((long)&heap_infos[0].fd + lVar6) = uVar3;
      if ((int)uVar3 < 1) {
        bVar2 = false;
      }
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x80);
  if (!bVar2) {
    pRVar5 = &heap_infos[0].fd;
    uVar7 = 0;
    do {
      if (*pRVar5 < 1) {
        orig = (RK_U32)uVar7;
        MVar4 = try_flip_flag(orig,2);
        if ((((MVar4 != MPP_OK) && (MVar4 = try_flip_flag(orig,1), MVar4 != MPP_OK)) &&
            (MVar4 = try_flip_flag(orig,3), MVar4 != MPP_OK)) && (((byte)dma_heap_debug & 8) != 0))
        {
          _mpp_log_l(4,"mpp_dma_heap","dma-heap type %x - %s remap failed\n",(char *)0x0,
                     uVar7 & 0xffffffff,((DmaHeapInfo *)(pRVar5 + -2))->name);
        }
      }
      uVar7 = uVar7 + 1;
      pRVar5 = pRVar5 + 4;
    } while (uVar7 != 8);
  }
  return;
}

Assistant:

__attribute__ ((constructor))
void dma_heap_init(void)
{
    DmaHeapInfo *info = NULL;
    RK_U32 all_success = 1;
    RK_U32 i;

    mpp_env_get_u32("dma_heap_debug", &dma_heap_debug, 0);

    /* go through all heap first */
    for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
        info = &heap_infos[i];

        if (info->fd > 0)
            continue;

        info->fd = try_open_path(info->name);
        if (info->fd <= 0)
            all_success = 0;
    }

    if (!all_success) {
        /* check remaining failed heap mapping */
        for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
            info = &heap_infos[i];

            if (info->fd > 0)
                continue;

            /* if original heap failed then try revert cacheable flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_CACHABLE))
                continue;

            /* if cacheable heap failed then try revert dma32 flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_DMA32))
                continue;

            /* if dma32 heap failed then try revert both cacheable and dma32 flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_CACHABLE | MPP_ALLOC_FLAG_DMA32))
                continue;

            dma_heap_dbg_chk("dma-heap type %x - %s remap failed\n", i, info->name);
        }
    }
}